

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O1

void event_go_to_time_for_bed(tgestate_t *state)

{
  uint8_t *puVar1;
  
  state->bell = '(';
  state->locked_doors[0] = 0x80;
  state->locked_doors[1] = 0x81;
  queue_message(state,message_TIME_FOR_BED);
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = 0x85;
    state->vischars[0].route.step = '\x02';
    set_route(state,state->vischars);
  }
  set_prisoners_and_guards_route_B(state,(route_t *)&go_to_time_for_bed_t5);
  return;
}

Assistant:

static void event_go_to_time_for_bed(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;

  /* Lock the gates. */
  state->locked_doors[0] = 0 | door_LOCKED; /* Index into doors + set locked flag. */
  state->locked_doors[1] = 1 | door_LOCKED;

  queue_message(state, message_TIME_FOR_BED);
  go_to_time_for_bed(state);
}